

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_dataview_constructor(JSContext *ctx,JSValue new_target,int argc,JSValue *argv)

{
  list_head *plVar1;
  int64_t iVar2;
  int iVar3;
  JSArrayBuffer *pJVar4;
  list_head *plVar5;
  JSRefCountHeader *p;
  JSValue JVar6;
  JSValue val;
  uint local_58;
  uint64_t offset;
  uint64_t local_48;
  JSValueUnion local_40;
  uint64_t l;
  
  JVar6.tag = new_target.tag;
  local_40 = new_target.u;
  plVar1 = (list_head *)(argv->u).ptr;
  iVar2 = argv->tag;
  pJVar4 = js_get_array_buffer(ctx,*argv);
  if ((pJVar4 == (JSArrayBuffer *)0x0) ||
     ((offset = 0, 1 < argc && (iVar3 = JS_ToIndex(ctx,&offset,argv[1]), iVar3 != 0)))) {
LAB_0012ce4e:
    return (JSValue)(ZEXT816(6) << 0x40);
  }
  if (pJVar4->detached != '\0') {
    JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    goto LAB_0012ce4e;
  }
  if ((ulong)(long)pJVar4->byte_length < offset) {
    JS_ThrowRangeError(ctx,"invalid byteOffset");
    goto LAB_0012cf20;
  }
  local_58 = pJVar4->byte_length - (int)offset;
  local_48 = offset;
  if ((2 < argc) && ((int)argv[2].tag != 3)) {
    val.tag = argv[2].tag;
    val.u.ptr = argv[2].u.ptr;
    iVar3 = JS_ToIndex(ctx,&l,val);
    if (iVar3 != 0) goto LAB_0012cf20;
    if (local_58 < l) {
      JS_ThrowRangeError(ctx,"invalid byteLength");
      goto LAB_0012cf20;
    }
    local_58 = (uint)l;
  }
  JVar6.u.float64 = local_40.float64;
  JVar6 = js_create_from_ctor(ctx,JVar6,0x1e);
  if ((int)JVar6.tag != 6) {
    if (pJVar4->detached == '\0') {
      plVar5 = (list_head *)js_malloc(ctx,0x28);
      if (plVar5 != (list_head *)0x0) {
        ((JSValueUnion *)(plVar5 + 1))->ptr = (void *)JVar6.u;
        if (0xfffffff4 < (uint)iVar2) {
          *(int *)&plVar1->prev = *(int *)&plVar1->prev + 1;
        }
        plVar5[1].next = plVar1;
        *(int *)&plVar5[2].prev = (int)local_48;
        *(uint *)((long)&plVar5[2].prev + 4) = local_58;
        plVar1 = (pJVar4->array_list).prev;
        plVar1->next = plVar5;
        plVar5->prev = plVar1;
        plVar5->next = &pJVar4->array_list;
        (pJVar4->array_list).prev = plVar5;
        *(list_head **)((long)JVar6.u.ptr + 0x30) = plVar5;
        return JVar6;
      }
    }
    else {
      JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    }
    JS_FreeValue(ctx,JVar6);
  }
LAB_0012cf20:
  return (JSValue)(ZEXT816(6) << 0x40);
}

Assistant:

static JSValue js_dataview_constructor(JSContext *ctx,
                                       JSValueConst new_target,
                                       int argc, JSValueConst *argv)
{
    JSArrayBuffer *abuf;
    uint64_t offset;
    uint32_t len;
    JSValueConst buffer;
    JSValue obj;
    JSTypedArray *ta;
    JSObject *p;

    buffer = argv[0];
    abuf = js_get_array_buffer(ctx, buffer);
    if (!abuf)
        return JS_EXCEPTION;
    offset = 0;
    if (argc > 1) {
        if (JS_ToIndex(ctx, &offset, argv[1]))
            return JS_EXCEPTION;
    }
    if (abuf->detached)
        return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
    if (offset > abuf->byte_length)
        return JS_ThrowRangeError(ctx, "invalid byteOffset");
    len = abuf->byte_length - offset;
    if (argc > 2 && !JS_IsUndefined(argv[2])) {
        uint64_t l;
        if (JS_ToIndex(ctx, &l, argv[2]))
            return JS_EXCEPTION;
        if (l > len)
            return JS_ThrowRangeError(ctx, "invalid byteLength");
        len = l;
    }

    obj = js_create_from_ctor(ctx, new_target, JS_CLASS_DATAVIEW);
    if (JS_IsException(obj))
        return JS_EXCEPTION;
    if (abuf->detached) {
        /* could have been detached in js_create_from_ctor() */
        JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        goto fail;
    }
    ta = js_malloc(ctx, sizeof(*ta));
    if (!ta) {
    fail:
        JS_FreeValue(ctx, obj);
        return JS_EXCEPTION;
    }
    p = JS_VALUE_GET_OBJ(obj);
    ta->obj = p;
    ta->buffer = JS_VALUE_GET_OBJ(JS_DupValue(ctx, buffer));
    ta->offset = offset;
    ta->length = len;
    list_add_tail(&ta->link, &abuf->array_list);
    p->u.typed_array = ta;
    return obj;
}